

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetQueue.h
# Opt level: O3

void __thiscall
dg::ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push
          (SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *this,ValueType *what)

{
  iterator *piVar1;
  _Elt_pointer ppFVar2;
  pair<std::_Rb_tree_iterator<const_llvm::Function_*>,_bool> pVar3;
  
  pVar3 = std::
          _Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
          ::_M_insert_unique<llvm::Function_const*const&>
                    ((_Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                      *)this,what);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppFVar2 = (this->_queue).Container.c.
              super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppFVar2 ==
        *(_Elt_pointer *)
         ((long)&(this->_queue).Container.c.
                 super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_push_back_aux<llvm::Function_const*const&>
                ((deque<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)&this->_queue
                 ,what);
      return;
    }
    *ppFVar2 = *what;
    piVar1 = &(this->_queue).Container.c.
              super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void push(const ValueType &what) {
        if (_queued.insert(what).second)
            _queue.push(what);
    }